

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::TrackFloatSymEquivalence(BackwardPass *this,Instr *instr)

{
  Type TVar1;
  Opnd *this_00;
  StackSym *pSVar2;
  StackSym *pSVar3;
  Type pJVar4;
  long lVar5;
  code *pcVar6;
  FloatSymEquivalenceClass *pFVar7;
  bool bVar8;
  OpndKind OVar9;
  bool bVar10;
  BOOLEAN BVar11;
  BailOutKind BVar12;
  undefined4 *puVar13;
  RegOpnd *pRVar14;
  FloatSymEquivalenceClass *pFVar15;
  FloatSymEquivalenceClass *pFVar16;
  FloatSymEquivalenceClass **value;
  FloatSymEquivalenceMap *this_01;
  ulong uVar17;
  ulong uVar18;
  uint local_4c;
  FloatSymEquivalenceClass *pFStack_48;
  BVIndex id;
  FloatSymEquivalenceClass *local_40;
  FloatSymEquivalenceClass *srcEquivalenceClass;
  FloatSymEquivalenceClass *dstEquivalenceClass;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1db2,"(instr)","instr");
    if (!bVar8) goto LAB_003e69a1;
    *puVar13 = 0;
  }
  if (this->tag != DeadStorePhase) {
    return;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    return;
  }
  if ((instr->m_func->field_0x240 & 0x10) == 0) {
    return;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    return;
  }
  OVar9 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar9 != OpndKindReg) {
    return;
  }
  this_00 = instr->m_dst;
  OVar9 = IR::Opnd::GetKind(this_00);
  if (OVar9 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar8) goto LAB_003e69a1;
    *puVar13 = 0;
  }
  pSVar2 = (StackSym *)this_00[1]._vptr_Opnd;
  if (pSVar2->m_type != TyFloat64) {
    return;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    return;
  }
  OVar9 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar9 != OpndKindReg) {
    return;
  }
  pRVar14 = IR::Opnd::AsRegOpnd(instr->m_src1);
  pSVar3 = pRVar14->m_sym;
  bVar8 = OpCodeAttr::NonIntTransfer(instr->m_opcode);
  if ((!bVar8) ||
     ((this->currentBlock->loop != (Loop *)0x0 && (this->currentPrePassLoop == (Loop *)0x0)))) {
    if ((instr->field_0x38 & 0x10) == 0) {
      return;
    }
    BVar12 = IR::Instr::GetBailOutKind(instr);
    if (BVar12 != BailOutPrimitiveButString) {
      return;
    }
    if (instr->m_opcode != FromVar) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1e14,"(instr->m_opcode == Js::OpCode::FromVar)",
                         "instr->m_opcode == Js::OpCode::FromVar");
      if (!bVar8) goto LAB_003e69a1;
      *puVar13 = 0;
    }
    srcEquivalenceClass = (FloatSymEquivalenceClass *)0x0;
    if ((pSVar2->field_0x1a & 2) == 0) {
      bVar8 = JsUtil::
              BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        (this->floatSymEquivalenceMap,&(pSVar2->super_Sym).m_id,&srcEquivalenceClass
                        );
      if (!bVar8) {
        return;
      }
      if (srcEquivalenceClass->requiresBailOnNotNumber != true) {
        return;
      }
    }
    IR::Instr::SetBailOutKind(instr,BailOutNumberOnly);
    return;
  }
  if (pSVar3->m_type != TyFloat64) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1dcb,"(src->IsFloat64())","src->IsFloat64()");
    if (!bVar8) goto LAB_003e69a1;
    *puVar13 = 0;
  }
  if (pSVar2 == pSVar3) {
    return;
  }
  if (this->func->m_fg->hasLoop == false) {
    if ((pSVar2->field_0x1a & 2) == 0) {
      return;
    }
    pSVar3->field_0x1a = pSVar3->field_0x1a | 2;
    return;
  }
  srcEquivalenceClass = (FloatSymEquivalenceClass *)0x0;
  local_40 = (FloatSymEquivalenceClass *)0x0;
  pFStack_48 = (FloatSymEquivalenceClass *)&(pSVar2->super_Sym).m_id;
  bVar8 = JsUtil::
          BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<unsigned_int>
                    (this->floatSymEquivalenceMap,(uint *)pFStack_48,&srcEquivalenceClass);
  pFVar16 = (FloatSymEquivalenceClass *)&(pSVar3->super_Sym).m_id;
  bVar10 = JsUtil::
           BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::TryGetValue<unsigned_int>(this->floatSymEquivalenceMap,(uint *)pFVar16,&local_40);
  pFVar15 = local_40;
  if (!bVar8) {
    if (bVar10) {
      BVSparse<Memory::JitArenaAllocator>::Set(&local_40->bv,(pSVar2->super_Sym).m_id);
      if ((pSVar2->field_0x1a & 2) != 0) {
        pFVar15->requiresBailOnNotNumber = true;
      }
      this_01 = this->floatSymEquivalenceMap;
      value = &local_40;
      pFVar16 = pFStack_48;
      goto LAB_003e697e;
    }
    pFVar15 = (FloatSymEquivalenceClass *)
              new<Memory::JitArenaAllocator>(0x28,this->tempAlloc,0x3f1274);
    pJVar4 = this->tempAlloc;
    (pFVar15->bv).head = (Type_conflict)0x0;
    (pFVar15->bv).lastFoundIndex = (Type_conflict)0x0;
    (pFVar15->bv).alloc = pJVar4;
    (pFVar15->bv).lastUsedNodePrevNextField = (Type)pFVar15;
    pFVar15->requiresBailOnNotNumber = false;
    srcEquivalenceClass = pFVar15;
    BVSparse<Memory::JitArenaAllocator>::Set
              ((BVSparse<Memory::JitArenaAllocator> *)pFVar15,(pSVar2->super_Sym).m_id);
    if ((pSVar2->field_0x1a & 2) != 0) {
      pFVar15->requiresBailOnNotNumber = true;
    }
    JsUtil::
    BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->floatSymEquivalenceMap,(uint *)pFStack_48,&srcEquivalenceClass);
  }
  pFVar15 = srcEquivalenceClass;
  if (!bVar10) {
    BVSparse<Memory::JitArenaAllocator>::Set(&srcEquivalenceClass->bv,(pSVar3->super_Sym).m_id);
    if ((pSVar3->field_0x1a & 2) != 0) {
      pFVar15->requiresBailOnNotNumber = true;
    }
    this_01 = this->floatSymEquivalenceMap;
    value = &srcEquivalenceClass;
LAB_003e697e:
    JsUtil::
    BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_01,(uint *)pFVar16,value);
    return;
  }
  if (srcEquivalenceClass == local_40) {
    return;
  }
  BVar11 = BVSparse<Memory::JitArenaAllocator>::Test(&srcEquivalenceClass->bv,*(BVIndex *)pFVar16);
  if (BVar11 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1dfd,"(!dstEquivalenceClass->Bv()->Test(src->m_id))",
                       "!dstEquivalenceClass->Bv()->Test(src->m_id)");
    if (!bVar8) goto LAB_003e69a1;
    *puVar13 = 0;
  }
  BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                     (&local_40->bv,*(BVIndex *)&(pFStack_48->bv).head);
  if (BVar11 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1dfe,"(!srcEquivalenceClass->Bv()->Test(dst->m_id))",
                       "!srcEquivalenceClass->Bv()->Test(dst->m_id)");
    if (!bVar8) {
LAB_003e69a1:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar13 = 0;
  }
  pFVar7 = srcEquivalenceClass;
  pFVar15 = local_40;
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (&srcEquivalenceClass->bv,&local_40->bv);
  pFVar16 = local_40;
  if (pFVar15->requiresBailOnNotNumber == true) {
    pFVar7->requiresBailOnNotNumber = true;
  }
  while (pFVar16 = (FloatSymEquivalenceClass *)(pFVar16->bv).head,
        pFVar16 != (FloatSymEquivalenceClass *)0x0) {
    uVar18 = ((Type *)&(pFVar16->bv).alloc)->word;
    pFStack_48 = pFVar16;
    if (uVar18 != 0) {
      TVar1 = *(Type *)&(pFVar16->bv).lastFoundIndex;
      uVar17 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
        }
      }
      do {
        local_4c = (BVIndex)uVar17 + TVar1;
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar17);
        uVar18 = uVar18 & ~(1L << (uVar17 & 0x3f));
        JsUtil::
        BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this->floatSymEquivalenceMap,&local_4c,&srcEquivalenceClass);
        lVar5 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        uVar17 = (ulong)(-(uint)(uVar18 == 0) | (uint)lVar5);
        pFVar16 = pFStack_48;
      } while (uVar18 != 0);
    }
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BackwardPass::FloatSymEquivalenceClass>
            (this->tempAlloc,local_40);
  return;
}

Assistant:

void
BackwardPass::TrackFloatSymEquivalence(IR::Instr *const instr)
{
    /*
    This function determines sets of float-specialized syms where any two syms in a set may have the same value number at some
    point in the function. Conversely, if two float-specialized syms are not in the same set, it guarantees that those two syms
    will never have the same value number. These sets are referred to as equivalence classes here.

    The equivalence class for a sym is used to determine whether a bailout FromVar generating a float value for the sym needs to
    bail out on any non-number value. For instance, for syms s1 and s5 in an equivalence class (say we have s5 = s1 at some
    point), if there's a FromVar that generates a float value for s1 but only bails out on strings or non-primitives, and s5 is
    returned from the function, it has to be ensured that s5 is not converted to Var. If the source of the FromVar was null, the
    FromVar would not have bailed out, and s1 and s5 would have the value +0. When s5 is returned, we need to return null and
    not +0, so the equivalence class is used to determine that since s5 requires a bailout on any non-number value, so does s1.

    The tracking is very conservative because the bit that says "I require bailout on any non-number value" is on the sym itself
    (referred to as non-number bailout bit below).

    Data:
    - BackwardPass::floatSymEquivalenceMap
        - hash table mapping a float sym ID to its equivalence class
    - FloatSymEquivalenceClass
        - bit vector of float sym IDs that are in the equivalence class
        - one non-number bailout bit for all syms in the equivalence class

    Algorithm:
    - In a loop prepass or when not in loop:
        - For a float sym transfer (s0.f = s1.f), add both syms to an equivalence class (set the syms in a bit vector)
            - If either sym requires bailout on any non-number value, set the equivalence class' non-number bailout bit
        - If one of the syms is already in an equivalence class, merge the two equivalence classes by OR'ing the two bit vectors
          and the non-number bailout bit.
        - Note that for functions with a loop, dependency tracking is done using equivalence classes and that information is not
          transferred back into each sym's non-number bailout bit
    - In a loop non-prepass or when not in loop, for a FromVar instruction that requires bailout only on strings and
      non-primitives:
        - If the destination float sym's non-number bailout bit is set, or the sym is in an equivalence class whose non-number
          bailout bit is set, change the bailout to bail out on any non-number value

    The result is that if a float-specialized sym's value is used in a way in which it would be invalid to use the float value
    through any other float-specialized sym that acquires the value, the FromVar generating the float value will be modified to
    bail out on any non-number value.
    */

    Assert(instr);

    if(tag != Js::DeadStorePhase || instr->GetSrc2() || !instr->m_func->hasBailout)
    {
        return;
    }

    if(!instr->GetDst() || !instr->GetDst()->IsRegOpnd())
    {
        return;
    }
    const auto dst = instr->GetDst()->AsRegOpnd()->m_sym;
    if(!dst->IsFloat64())
    {
        return;
    }

    if(!instr->GetSrc1() || !instr->GetSrc1()->IsRegOpnd())
    {
        return;
    }
    const auto src = instr->GetSrc1()->AsRegOpnd()->m_sym;

    if(OpCodeAttr::NonIntTransfer(instr->m_opcode) && (!currentBlock->loop || IsPrePass()))
    {
        Assert(src->IsFloat64()); // dst is specialized, and since this is a float transfer, src must be specialized too

        if(dst == src)
        {
            return;
        }

        if(!func->m_fg->hasLoop)
        {
            // Special case for functions with no loops, since there can only be in-order dependencies. Just merge the two
            // non-number bailout bits and put the result in the source.
            if(dst->m_requiresBailOnNotNumber)
            {
                src->m_requiresBailOnNotNumber = true;
            }
            return;
        }

        FloatSymEquivalenceClass *dstEquivalenceClass = nullptr, *srcEquivalenceClass = nullptr;
        const bool dstHasEquivalenceClass = floatSymEquivalenceMap->TryGetValue(dst->m_id, &dstEquivalenceClass);
        const bool srcHasEquivalenceClass = floatSymEquivalenceMap->TryGetValue(src->m_id, &srcEquivalenceClass);

        if(!dstHasEquivalenceClass)
        {
            if(srcHasEquivalenceClass)
            {
                // Just add the destination into the source's equivalence class
                srcEquivalenceClass->Set(dst);
                floatSymEquivalenceMap->Add(dst->m_id, srcEquivalenceClass);
                return;
            }

            dstEquivalenceClass = JitAnew(tempAlloc, FloatSymEquivalenceClass, tempAlloc);
            dstEquivalenceClass->Set(dst);
            floatSymEquivalenceMap->Add(dst->m_id, dstEquivalenceClass);
        }

        if(!srcHasEquivalenceClass)
        {
            // Just add the source into the destination's equivalence class
            dstEquivalenceClass->Set(src);
            floatSymEquivalenceMap->Add(src->m_id, dstEquivalenceClass);
            return;
        }

        if(dstEquivalenceClass == srcEquivalenceClass)
        {
            return;
        }

        Assert(!dstEquivalenceClass->Bv()->Test(src->m_id));
        Assert(!srcEquivalenceClass->Bv()->Test(dst->m_id));

        // Merge the two equivalence classes. The source's equivalence class is typically smaller, so it's merged into the
        // destination's equivalence class. To save space and prevent a potential explosion of bit vector size,
        // 'floatSymEquivalenceMap' is updated for syms in the source's equivalence class to map to the destination's now merged
        // equivalence class, and the source's equivalence class is discarded.
        dstEquivalenceClass->Or(srcEquivalenceClass);
        FOREACH_BITSET_IN_SPARSEBV(id, srcEquivalenceClass->Bv())
        {
            floatSymEquivalenceMap->Item(id, dstEquivalenceClass);
        } NEXT_BITSET_IN_SPARSEBV;
        JitAdelete(tempAlloc, srcEquivalenceClass);

        return;
    }

    // Not a float transfer, and non-prepass (not necessarily in a loop)

    if(!instr->HasBailOutInfo() || instr->GetBailOutKind() != IR::BailOutPrimitiveButString)
    {
        return;
    }
    Assert(instr->m_opcode == Js::OpCode::FromVar);

    // If either the destination or its equivalence class says it requires bailout on any non-number value, adjust the bailout
    // kind on the instruction. Both are checked because in functions without loops, equivalence tracking is not done and only
    // the sym's non-number bailout bit will have the information, and in functions with loops, equivalence tracking is done
    // throughout the function and checking just the sym's non-number bailout bit is insufficient.
    FloatSymEquivalenceClass *dstEquivalenceClass = nullptr;
    if(dst->m_requiresBailOnNotNumber ||
        (floatSymEquivalenceMap->TryGetValue(dst->m_id, &dstEquivalenceClass) && dstEquivalenceClass->RequiresBailOnNotNumber()))
    {
        instr->SetBailOutKind(IR::BailOutNumberOnly);
    }
}